

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Integrator::Intersect(Integrator *this,Ray *ray,Float tMax)

{
  bool bVar1;
  undefined8 in_RDX;
  Ray *in_RSI;
  optional<pbrt::ShapeIntersection> *in_RDI;
  long *in_FS_OFFSET;
  optional<pbrt::ShapeIntersection> *this_00;
  
  *(long *)(*in_FS_OFFSET + -0x380) = *(long *)(*in_FS_OFFSET + -0x380) + 1;
  this_00 = in_RDI;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)&in_RSI->medium);
  if (bVar1) {
    PrimitiveHandle::Intersect((PrimitiveHandle *)this_00,in_RSI,(Float)((ulong)in_RDX >> 0x20));
  }
  else {
    memset(in_RDI,0,0x108);
    pstd::optional<pbrt::ShapeIntersection>::optional(in_RDI);
  }
  return in_RDI;
}

Assistant:

pstd::optional<ShapeIntersection> Integrator::Intersect(const Ray &ray,
                                                        Float tMax) const {
    ++nIntersectionTests;
    DCHECK_NE(ray.d, Vector3f(0, 0, 0));
    if (aggregate)
        return aggregate.Intersect(ray, tMax);
    else
        return {};
}